

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool __thiscall
crnlib::image_utils::error_metrics::compute
          (error_metrics *this,image_u8 *a,image_u8 *b,uint first_channel,uint num_channels,
          bool average_component_error)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  color_quad<unsigned_char,_int> *this_00;
  color_quad<unsigned_char,_int> *this_01;
  long lVar8;
  int in_ECX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  byte in_R9B;
  double dVar9;
  double total_values;
  double x_1;
  uint i;
  double sum2;
  double sum;
  uint c;
  color_quad_u8 *cb;
  color_quad_u8 *ca;
  uint x;
  uint y;
  double hist [256];
  uint height;
  uint width;
  double local_880;
  uint local_86c;
  double local_868;
  double local_860;
  uint local_854;
  uint local_840;
  uint local_83c;
  double local_838 [257];
  uint local_2c;
  uint local_28;
  byte local_21;
  uint local_20;
  int local_1c;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_18;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_10;
  
  local_21 = in_R9B & 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RSI);
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_18);
  local_28 = math::minimum<unsigned_int>(uVar3,uVar4);
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_10);
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_18);
  local_2c = math::minimum<unsigned_int>(uVar3,uVar4);
  utils::zero_object<double[256]>((double (*) [256])0x12eb41);
  for (local_83c = 0; local_83c < local_2c; local_83c = local_83c + 1) {
    for (local_840 = 0; local_840 < local_28; local_840 = local_840 + 1) {
      this_00 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                          (local_10,local_840,local_83c);
      this_01 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                          (local_18,local_840,local_83c);
      if (local_20 == 0) {
        iVar5 = color_quad<unsigned_char,_int>::get_luma(this_00);
        iVar6 = color_quad<unsigned_char,_int>::get_luma(this_01);
        lVar8 = (long)(iVar5 - iVar6);
        if (lVar8 < 1) {
          lVar8 = -lVar8;
        }
        local_838[lVar8] = local_838[lVar8] + 1.0;
      }
      else {
        for (local_854 = 0; local_854 < local_20; local_854 = local_854 + 1) {
          bVar1 = color_quad<unsigned_char,_int>::operator[](this_00,local_1c + local_854);
          bVar2 = color_quad<unsigned_char,_int>::operator[](this_01,local_1c + local_854);
          lVar8 = (long)(int)((uint)bVar1 - (uint)bVar2);
          if (lVar8 < 1) {
            lVar8 = -lVar8;
          }
          local_838[lVar8] = local_838[lVar8] + 1.0;
        }
      }
    }
  }
  *in_RDI = 0;
  local_860 = 0.0;
  local_868 = 0.0;
  for (local_86c = 0; local_86c < 0x100; local_86c = local_86c + 1) {
    if ((local_838[local_86c] != 0.0) || (NAN(local_838[local_86c]))) {
      uVar7 = math::maximum<unsigned_int>(*in_RDI,local_86c);
      *in_RDI = uVar7;
      dVar9 = (double)local_86c * local_838[local_86c];
      local_860 = local_860 + dVar9;
      local_868 = (double)local_86c * dVar9 + local_868;
    }
  }
  local_880 = (double)(local_28 * local_2c);
  if ((local_21 & 1) != 0) {
    uVar7 = math::clamp<unsigned_int>(local_20,1,4);
    local_880 = (double)uVar7 * local_880;
  }
  dVar9 = math::clamp<double>(local_860 / local_880,0.0,255.0);
  *(double *)(in_RDI + 2) = dVar9;
  dVar9 = math::clamp<double>(local_868 / local_880,0.0,65025.0);
  *(double *)(in_RDI + 4) = dVar9;
  dVar9 = sqrt(*(double *)(in_RDI + 4));
  *(double *)(in_RDI + 6) = dVar9;
  if ((*(double *)(in_RDI + 6) != 0.0) || (NAN(*(double *)(in_RDI + 6)))) {
    dVar9 = log10(255.0 / *(double *)(in_RDI + 6));
    dVar9 = math::clamp<double>(dVar9 * 20.0,0.0,500.0);
    *(double *)(in_RDI + 8) = dVar9;
  }
  else {
    in_RDI[8] = 0;
    in_RDI[9] = 0x412e847e;
  }
  return true;
}

Assistant:

bool error_metrics::compute(const image_u8& a, const image_u8& b, uint first_channel, uint num_channels, bool average_component_error) {
  //if ( (!a.get_width()) || (!b.get_height()) || (a.get_width() != b.get_width()) || (a.get_height() != b.get_height()) )
  //   return false;

  const uint width = math::minimum(a.get_width(), b.get_width());
  const uint height = math::minimum(a.get_height(), b.get_height());

  CRNLIB_ASSERT((first_channel < 4U) && (first_channel + num_channels <= 4U));

  // Histogram approach due to Charles Bloom.
  double hist[256];
  utils::zero_object(hist);

  for (uint y = 0; y < height; y++) {
    for (uint x = 0; x < width; x++) {
      const color_quad_u8& ca = a(x, y);
      const color_quad_u8& cb = b(x, y);

      if (!num_channels)
        hist[labs(ca.get_luma() - cb.get_luma())]++;
      else {
        for (uint c = 0; c < num_channels; c++)
          hist[labs(ca[first_channel + c] - cb[first_channel + c])]++;
      }
    }
  }

  mMax = 0;
  double sum = 0.0f, sum2 = 0.0f;
  for (uint i = 0; i < 256; i++) {
    if (!hist[i])
      continue;

    mMax = math::maximum(mMax, i);

    double x = i * hist[i];

    sum += x;
    sum2 += i * x;
  }

  // See http://bmrc.berkeley.edu/courseware/cs294/fall97/assignment/psnr.html
  double total_values = width * height;

  if (average_component_error)
    total_values *= math::clamp<uint>(num_channels, 1, 4);

  mMean = math::clamp<double>(sum / total_values, 0.0f, 255.0f);
  mMeanSquared = math::clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

  mRootMeanSquared = sqrt(mMeanSquared);

  if (!mRootMeanSquared)
    mPeakSNR = cInfinitePSNR;
  else
    mPeakSNR = math::clamp<double>(log10(255.0f / mRootMeanSquared) * 20.0f, 0.0f, 500.0f);

  return true;
}